

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cwebp.c
# Opt level: O0

void PrintMetadataInfo(Metadata *metadata,int metadata_written)

{
  uint in_ESI;
  long in_RDI;
  
  if ((in_RDI != 0) && (in_ESI != 0)) {
    fprintf(stderr,"Metadata:\n");
    if ((in_ESI & 2) != 0) {
      fprintf(stderr,"  * ICC profile:  %6d bytes\n",*(ulong *)(in_RDI + 0x18) & 0xffffffff);
    }
    if ((in_ESI & 1) != 0) {
      fprintf(stderr,"  * EXIF data:    %6d bytes\n",*(ulong *)(in_RDI + 8) & 0xffffffff);
    }
    if ((in_ESI & 4) != 0) {
      fprintf(stderr,"  * XMP data:     %6d bytes\n",*(ulong *)(in_RDI + 0x28) & 0xffffffff);
    }
  }
  return;
}

Assistant:

static void PrintMetadataInfo(const Metadata* const metadata,
                              int metadata_written) {
  if (metadata == NULL || metadata_written == 0) return;

  fprintf(stderr, "Metadata:\n");
  if (metadata_written & METADATA_ICC) {
    fprintf(stderr, "  * ICC profile:  %6d bytes\n", (int)metadata->iccp.size);
  }
  if (metadata_written & METADATA_EXIF) {
    fprintf(stderr, "  * EXIF data:    %6d bytes\n", (int)metadata->exif.size);
  }
  if (metadata_written & METADATA_XMP) {
    fprintf(stderr, "  * XMP data:     %6d bytes\n", (int)metadata->xmp.size);
  }
}